

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_ktrace(jit_State *J)

{
  uint uVar1;
  IRIns *pIVar2;
  jit_State *in_RDI;
  IRIns *ir;
  IRRef ref;
  IRRef ref_1;
  jit_State *pjVar3;
  
  uVar1 = (in_RDI->cur).nk;
  pjVar3 = in_RDI;
  if (uVar1 <= in_RDI->irbotlim) {
    lj_ir_growbot(in_RDI);
  }
  (pjVar3->cur).nk = uVar1 - 1;
  pIVar2 = (in_RDI->cur).ir + (uVar1 - 1);
  (pIVar2->field_1).t.irt = '\t';
  (pIVar2->field_1).o = '\x1b';
  (pIVar2->field_1).op12 = 0;
  (pIVar2->field_0).prev = 0;
  return uVar1 + 0x8ffffff;
}

Assistant:

TRef lj_ir_ktrace(jit_State *J)
{
  IRRef ref = ir_nextkgc(J);
  IRIns *ir = IR(ref);
  lj_assertJ(irt_toitype_(IRT_P64) == LJ_TTRACE, "mismatched type mapping");
  ir->t.irt = IRT_P64;
  ir->o = LJ_GC64 ? IR_KNUM : IR_KNULL;  /* Not IR_KGC yet, but same size. */
  ir->op12 = 0;
  ir->prev = 0;
  return TREF(ref, IRT_P64);
}